

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcr.c
# Opt level: O0

void disablegc1(int noerror)

{
  ushort uVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  DLword *pDVar4;
  undefined4 local_20;
  DLword typeword;
  int i;
  int count;
  interruptstate *gcinterruptstate;
  int noerror_local;
  
  pLVar3 = NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
  for (local_20 = 0; local_20 < 0x8000; local_20 = local_20 + 1) {
    LVar2 = LAddrFromNative(MDStypetbl);
    pDVar4 = NativeAligned2FromLAddr(LVar2 + local_20);
    uVar1 = *(ushort *)((ulong)pDVar4 ^ 2);
    LVar2 = LAddrFromNative(MDStypetbl);
    pDVar4 = NativeAligned2FromLAddr(LVar2 + local_20);
    *(ushort *)((ulong)pDVar4 ^ 2) = uVar1 | 0x8000;
  }
  *Reclaim_cnt_word = 0;
  *ReclaimMin_word = 0;
  if ((noerror == 0) && (*GcDisabled_word == 0)) {
    *(ushort *)((long)pLVar3 + 2) = *(ushort *)((long)pLVar3 + 2) & 0xefff | 0x1000;
    *PENDINGINTERRUPT_word = 0x4c;
  }
  *GcDisabled_word = 0x4c;
  return;
}

Assistant:

void disablegc1(int noerror) {
  struct interruptstate *gcinterruptstate;
  int count, i;
  DLword typeword;
  gcinterruptstate = (struct interruptstate *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
  count = (128) * 256; /* This is test value. 128 is *MdsTTsize(\MDSTTsize) */
  for (i = 0; i < count; i++) {
    typeword = GETWORD((DLword *)NativeAligned2FromLAddr(LAddrFromNative(MDStypetbl) + i));
    GETWORD((DLword *)NativeAligned2FromLAddr(LAddrFromNative(MDStypetbl) + i)) = (typeword | TT_NOREF);
  }
  *Reclaim_cnt_word = NIL;
  *ReclaimMin_word = NIL;
  if ((noerror == NIL) && (*GcDisabled_word == NIL)) {
    gcinterruptstate->gcdisabled = T;
    *PENDINGINTERRUPT_word = ATOM_T;
  }
  *GcDisabled_word = ATOM_T;
}